

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise::forward(ConvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob)

{
  long lVar1;
  void *pvVar2;
  void *pvVar3;
  int iVar4;
  int i;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  size_type __n;
  long lVar18;
  long lVar19;
  ulong uVar20;
  int j;
  int q;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  int iVar24;
  int _w;
  void *pvVar25;
  float fVar26;
  long local_150;
  Mat bottom_blob_bordered;
  void *local_108;
  Mat m;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  iVar16 = bottom_blob->c;
  if (iVar16 % this->group != 0) {
    return -100;
  }
  if (this->num_output % this->group != 0) {
    return -100;
  }
  iVar24 = bottom_blob->w;
  iVar15 = bottom_blob->h;
  uVar12 = (this->kernel_w + -1) * this->dilation_w;
  uVar21 = (this->kernel_h + -1) * this->dilation_h;
  Mat::Mat(&bottom_blob_bordered,bottom_blob);
  iVar4 = this->pad_w;
  iVar22 = this->pad_h;
  if (iVar22 < 1 && iVar4 < 1) {
    if (iVar22 == -0xe9 && iVar4 == -0xe9) {
      iVar4 = uVar12 - (iVar24 + -1) % this->stride_w;
      iVar22 = uVar21 - (iVar15 + -1) % this->stride_h;
      if ((0 < iVar4) ||
         (iVar24 = bottom_blob_bordered.w, iVar15 = bottom_blob_bordered.h, 0 < iVar22)) {
        copy_make_border(bottom_blob,&bottom_blob_bordered,iVar22 / 2,iVar22 - iVar22 / 2,iVar4 / 2,
                         iVar4 - iVar4 / 2,0,0.0);
        goto LAB_00125083;
      }
    }
  }
  else {
    copy_make_border(bottom_blob,&bottom_blob_bordered,iVar22,iVar22,iVar4,iVar4,0,0.0);
LAB_00125083:
    iVar4 = -100;
    if ((bottom_blob_bordered.data == (void *)0x0) ||
       (iVar24 = bottom_blob_bordered.w, iVar15 = bottom_blob_bordered.h,
       (long)bottom_blob_bordered.c * bottom_blob_bordered.cstep == 0)) goto LAB_001256af;
  }
  iVar22 = (int)(~uVar12 + iVar24) / this->stride_w;
  iVar15 = (int)(~uVar21 + iVar15) / this->stride_h;
  _w = iVar22 + 1;
  Mat::create(top_blob,_w,iVar15 + 1,this->num_output,4);
  iVar4 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    uVar12 = this->kernel_w * this->kernel_h;
    __n = (size_type)(int)uVar12;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,__n,(allocator_type *)&m);
    iVar4 = this->dilation_h;
    iVar17 = this->kernel_w;
    iVar5 = this->dilation_w * iVar17;
    iVar10 = 0;
    lVar18 = 0;
    for (iVar6 = 0; iVar6 < this->kernel_h; iVar6 = iVar6 + 1) {
      for (lVar19 = 0; (int)lVar19 < iVar17; lVar19 = lVar19 + 1) {
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)lVar18 + lVar19] = iVar10;
        iVar10 = iVar10 + this->dilation_w;
        iVar17 = this->kernel_w;
      }
      iVar10 = iVar10 + (iVar24 * iVar4 - iVar5);
      lVar18 = (int)lVar18 + lVar19;
    }
    iVar24 = this->group;
    if (iVar24 == this->num_output && iVar16 == iVar24) {
      local_150 = 0;
      uVar13 = 0;
      if (0 < (int)uVar12) {
        uVar13 = (ulong)uVar12;
      }
      for (lVar18 = 0; lVar18 < iVar16; lVar18 = lVar18 + 1) {
        Mat::channel(&m,top_blob,(int)lVar18);
        pvVar25 = m.data;
        Mat::~Mat(&m);
        pvVar2 = (this->weight_data).data;
        m.data = (void *)(bottom_blob_bordered.cstep * lVar18 * bottom_blob_bordered.elemsize +
                         (long)bottom_blob_bordered.data);
        m.refcount = (int *)0x0;
        m.elemsize = bottom_blob_bordered.elemsize;
        m.dims = 2;
        m.w = bottom_blob_bordered.w;
        m.h = bottom_blob_bordered.h;
        m.c = 1;
        m.cstep = (size_t)(bottom_blob_bordered.h * bottom_blob_bordered.w);
        for (iVar16 = 0; iVar16 <= iVar15; iVar16 = iVar16 + 1) {
          iVar24 = this->bias_term;
          pvVar3 = (this->bias_data).data;
          iVar4 = this->stride_h;
          iVar17 = this->stride_w;
          for (lVar19 = 0; lVar19 <= iVar22; lVar19 = lVar19 + 1) {
            if (iVar24 == 0) {
              fVar26 = 0.0;
            }
            else {
              fVar26 = *(float *)((long)pvVar3 + lVar18 * 4);
            }
            for (uVar7 = 0; uVar13 != uVar7; uVar7 = uVar7 + 1) {
              fVar26 = fVar26 + *(float *)((long)pvVar2 + uVar7 * 4 + local_150) *
                                *(float *)((long)m.data +
                                          (long)_space_ofs.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start[uVar7] * 4
                                          + lVar19 * iVar17 * 4 +
                                            (long)(iVar16 * bottom_blob_bordered.w * iVar4) * 4);
            }
            *(float *)((long)pvVar25 + lVar19 * 4) = fVar26;
          }
          pvVar25 = (void *)((long)pvVar25 + (long)_w * 4);
        }
        Mat::~Mat(&m);
        iVar16 = this->group;
        local_150 = local_150 + __n * 4;
      }
    }
    else {
      uVar21 = this->num_output / iVar24;
      iVar17 = (int)((long)iVar16 / (long)iVar24);
      iVar4 = 0;
      uVar13 = 0;
      if (0 < (int)uVar12) {
        uVar13 = (ulong)uVar12;
      }
      uVar7 = 0;
      if (0 < iVar17) {
        uVar7 = (long)iVar16 / (long)iVar24 & 0xffffffff;
      }
      uVar20 = 0;
      if (0 < (int)uVar21) {
        uVar20 = (ulong)uVar21;
      }
      for (lVar18 = 0; lVar18 < iVar24; lVar18 = lVar18 + 1) {
        lVar19 = (long)iVar4 << 2;
        for (uVar9 = 0; uVar9 != uVar20; uVar9 = uVar9 + 1) {
          lVar1 = uVar9 + lVar18 * (int)uVar21;
          Mat::channel(&m,top_blob,(int)lVar1);
          local_108 = m.data;
          Mat::~Mat(&m);
          pvVar25 = (this->weight_data).data;
          for (iVar16 = 0; iVar16 <= iVar15; iVar16 = iVar16 + 1) {
            for (lVar11 = 0; lVar11 <= iVar22; lVar11 = lVar11 + 1) {
              if (this->bias_term == 0) {
                fVar26 = 0.0;
              }
              else {
                fVar26 = *(float *)((long)(this->bias_data).data + lVar1 * 4);
              }
              lVar14 = (long)pvVar25 + lVar19;
              for (uVar23 = 0; uVar23 != uVar7; uVar23 = uVar23 + 1) {
                m.data = (void *)((lVar18 * iVar17 + uVar23) * bottom_blob_bordered.cstep *
                                  bottom_blob_bordered.elemsize + (long)bottom_blob_bordered.data);
                m.refcount = (int *)0x0;
                m.elemsize = bottom_blob_bordered.elemsize;
                m.dims = 2;
                m.w = bottom_blob_bordered.w;
                m.h = bottom_blob_bordered.h;
                m.c = 1;
                m.cstep = (size_t)(bottom_blob_bordered.h * bottom_blob_bordered.w);
                for (uVar8 = 0; uVar13 != uVar8; uVar8 = uVar8 + 1) {
                  fVar26 = fVar26 + *(float *)(lVar14 + uVar8 * 4) *
                                    *(float *)((long)m.data +
                                              (long)_space_ofs.
                                                    super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_start[uVar8]
                                              * 4 + (long)this->stride_w * (long)(int)lVar11 * 4 +
                                                    (long)(bottom_blob_bordered.w * iVar16 *
                                                          this->stride_h) * 4);
                }
                Mat::~Mat(&m);
                lVar14 = lVar14 + __n * 4;
              }
              *(float *)((long)local_108 + lVar11 * 4) = fVar26;
            }
            local_108 = (void *)((long)local_108 + (long)_w * 4);
          }
          lVar19 = lVar19 + (long)(int)(iVar17 * uVar12) * 4;
        }
        iVar24 = this->group;
        iVar4 = iVar4 + uVar21 * iVar17 * uVar12;
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
    iVar4 = 0;
  }
LAB_001256af:
  Mat::~Mat(&bottom_blob_bordered);
  return iVar4;
}

Assistant:

int ConvolutionDepthWise::forward(const Mat& bottom_blob, Mat& top_blob) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

//     fprintf(stderr, "ConvolutionDepthWise input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered = bottom_blob;
    if (pad_w > 0 || pad_h > 0)
    {
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_w == -233 && pad_h == -233)
    {
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, 0.f);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    top_blob.create(outw, outh, num_output);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for
        for (int g=0; g<group; g++)
        {
            float* outptr = top_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            const Mat m = bottom_blob_bordered.channel(g);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[g];

                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        float w = kptr[k];
                        sum += val * w;
                    }

                    outptr[j] = sum;
                }

                outptr += outw;
            }
        }

        return 0;
    }

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

#ifdef _WIN32
    #pragma omp parallel for
#else // _WIN32
    #pragma omp parallel for collapse(2)
#endif // _WIN32
    for (int g=0; g<group; g++)
    {
        for (int p=0; p<num_output_g; p++)
        {
            float* outptr = top_blob.channel(g * num_output_g + p);
            const float* weight_data_ptr = (const float*)weight_data + maxk * channels_g * num_output_g * g;

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[num_output_g * g + p];

                    const float* kptr = weight_data_ptr + maxk * channels_g * p;

                    // channels_g
                    for (int q=0; q<channels_g; q++)
                    {
                        const Mat m = bottom_blob_bordered.channel(channels_g * g + q);
                        const float* sptr = m.row(i*stride_h) + j*stride_w;

                        for (int k = 0; k < maxk; k++)
                        {
                            float val = sptr[ space_ofs[k] ];
                            float w = kptr[k];
                            sum += val * w;
                        }

                        kptr += maxk;
                    }

                    outptr[j] = sum;
                }

                outptr += outw;
            }
        }
    }

    return 0;
}